

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O0

void __thiscall trieste::logging::Log::start(Log *this,LogLevel level)

{
  bool bVar1;
  _Setw _Var2;
  size_t *psVar3;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ostream *poVar5;
  LogLevel level_local;
  Log *this_local;
  
  detail::
  UnsafeInit<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::init<>(&this->strstream);
  if (level == String) {
    this->print = ActiveNoOutput;
    this->indent_chars = 0;
  }
  else {
    this->print = Active;
    psVar3 = thread_local_indent();
    this->indent_chars = *psVar3;
    bVar1 = std::function::operator_cast_to_bool((function *)&header_callback_abi_cxx11_);
    if (bVar1) {
      psVar3 = thread_local_indent();
      this->indent_chars = *psVar3 + 5;
      pbVar4 = detail::
               UnsafeInit<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::get(&this->strstream);
      CLI::std::
      function<void_(std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()(&header_callback_abi_cxx11_,pbVar4);
    }
    else {
      pbVar4 = detail::
               UnsafeInit<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::get(&this->strstream);
      _Var2 = CLI::std::setw((int)this->indent_chars);
      poVar5 = std::operator<<((ostream *)&pbVar4->field_0x10,_Var2);
      std::operator<<(poVar5,"");
    }
  }
  return;
}

Assistant:

SNMALLOC_SLOW_PATH void start(detail::LogLevel level)
    {
      strstream.init();
      if (level == detail::LogLevel::String)
      {
        print = Status::ActiveNoOutput;
        indent_chars = 0;
        return;
      }
      print = Status::Active;
      indent_chars = thread_local_indent();
      if (header_callback)
      {
        // Indent all lines after a header by 5 spaces.
        indent_chars = 5 + thread_local_indent();
        // Add the header.
        header_callback(strstream.get());
      }
      else
      {
        strstream.get() << std::setw(indent_chars) << "";
      }
    }